

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_init_do(Curl_easy *data,connectdata *conn)

{
  char *pcVar1;
  Curl_HttpReq CVar2;
  curltime cVar3;
  
  (conn->bits).do_more = false;
  (data->state).done = false;
  (data->state).expect100header = false;
  if (((data->state).wildcardmatch == true) && ((conn->handler->flags & 0x1000) == 0)) {
    (data->state).wildcardmatch = false;
  }
  CVar2 = HTTPREQ_HEAD;
  if (((data->set).opt_no_body != false) ||
     (CVar2 = HTTPREQ_GET, (data->set).httpreq == HTTPREQ_HEAD)) {
    (data->set).httpreq = CVar2;
  }
  cVar3 = Curl_now();
  (data->req).start.tv_sec = cVar3.tv_sec;
  (data->req).start.tv_usec = cVar3.tv_usec;
  (data->req).now.tv_sec = (data->req).start.tv_sec;
  (data->req).now.tv_usec = (data->req).start.tv_usec;
  *(undefined4 *)&(data->req).now.field_0xc = *(undefined4 *)&(data->req).start.field_0xc;
  (data->req).header = true;
  (data->req).bytecount = 0;
  pcVar1 = (data->state).headerbuff;
  (data->req).buf = (data->state).buffer;
  (data->req).hbufp = pcVar1;
  (data->req).ignorebody = false;
  Curl_speedinit(data);
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_init_do(struct Curl_easy *data, struct connectdata *conn)
{
  struct SingleRequest *k = &data->req;

  conn->bits.do_more = FALSE; /* by default there's no curl_do_more() to
                                 use */

  data->state.done = FALSE; /* *_done() is not called yet */
  data->state.expect100header = FALSE;

  /* if the protocol used doesn't support wildcards, switch it off */
  if(data->state.wildcardmatch &&
     !(conn->handler->flags & PROTOPT_WILDCARD))
    data->state.wildcardmatch = FALSE;

  if(data->set.opt_no_body)
    /* in HTTP lingo, no body means using the HEAD request... */
    data->set.httpreq = HTTPREQ_HEAD;
  else if(HTTPREQ_HEAD == data->set.httpreq)
    /* ... but if unset there really is no perfect method that is the
       "opposite" of HEAD but in reality most people probably think GET
       then. The important thing is that we can't let it remain HEAD if the
       opt_no_body is set FALSE since then we'll behave wrong when getting
       HTTP. */
    data->set.httpreq = HTTPREQ_GET;

  k->start = Curl_now(); /* start time */
  k->now = k->start;   /* current time is now */
  k->header = TRUE; /* assume header */

  k->bytecount = 0;

  k->buf = data->state.buffer;
  k->hbufp = data->state.headerbuff;
  k->ignorebody = FALSE;

  Curl_speedinit(data);

  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);

  return CURLE_OK;
}